

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer_manager.cpp
# Opt level: O2

bool __thiscall duckdb::CSVBufferManager::ReadNextAndCacheIt(CSVBufferManager *this)

{
  shared_ptr<duckdb::CSVBuffer,_true> *this_00;
  ulong uVar1;
  CSVBuffer *pCVar2;
  CSVFileHandle *file_handle;
  type buffer_size;
  ulong uVar3;
  byte unaff_BPL;
  shared_ptr<duckdb::CSVBuffer,_true> maybe_last_buffer;
  element_type *local_40;
  
  this_00 = &this->last_buffer;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 2) goto LAB_0199f520;
    pCVar2 = shared_ptr<duckdb::CSVBuffer,_true>::operator->(this_00);
    uVar1 = uVar3 + 1;
  } while (pCVar2->last_buffer != false);
  file_handle = (CSVFileHandle *)shared_ptr<duckdb::CSVBuffer,_true>::operator->(this_00);
  buffer_size = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>
                ::operator*(&this->file_handle);
  CSVBuffer::Next((CSVBuffer *)&stack0xffffffffffffffc0,file_handle,(idx_t)buffer_size,
                  (bool *)this->buffer_size);
  unaff_BPL = local_40 != (element_type *)0x0;
  if (local_40 == (element_type *)0x0) {
    pCVar2 = shared_ptr<duckdb::CSVBuffer,_true>::operator->(this_00);
    pCVar2->last_buffer = true;
  }
  else {
    shared_ptr<duckdb::CSVBuffer,_true>::operator=
              (this_00,(shared_ptr<duckdb::CSVBuffer,_true> *)&stack0xffffffffffffffc0);
    pCVar2 = shared_ptr<duckdb::CSVBuffer,_true>::operator->(this_00);
    this->bytes_read = this->bytes_read + pCVar2->actual_buffer_size;
    ::std::
    vector<duckdb::shared_ptr<duckdb::CSVBuffer,true>,std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::CSVBuffer,true>&>
              ((vector<duckdb::shared_ptr<duckdb::CSVBuffer,true>,std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,true>>>
                *)&this->cached_buffers,this_00);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
LAB_0199f520:
  return (bool)(uVar3 < 2 & unaff_BPL);
}

Assistant:

bool CSVBufferManager::ReadNextAndCacheIt() {
	D_ASSERT(last_buffer);
	for (idx_t i = 0; i < 2; i++) {
		if (!last_buffer->IsCSVFileLastBuffer()) {
			auto maybe_last_buffer = last_buffer->Next(*file_handle, buffer_size, has_seeked);
			if (!maybe_last_buffer) {
				last_buffer->last_buffer = true;
				return false;
			}
			last_buffer = std::move(maybe_last_buffer);
			bytes_read += last_buffer->GetBufferSize();
			cached_buffers.emplace_back(last_buffer);
			return true;
		}
	}
	return false;
}